

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  ImGuiTabItem *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiShrinkWidthItem *__src;
  bool bVar6;
  ImVec2 size;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiID IVar14;
  ImGuiTabItemFlags IVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  ImGuiTabItem *pIVar23;
  ImGuiTabItem *pIVar24;
  char *pcVar25;
  ImGuiShrinkWidthItem *__dest;
  char *__dest_00;
  uint uVar26;
  int iVar27;
  undefined8 *puVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  size_t size_00;
  long lVar32;
  float fVar33;
  float fVar34;
  ImVec2 IVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  ImGuiTabItem item_tmp;
  ImGuiID local_d4;
  ImGuiTabItem *local_d0;
  ImVec4 local_88;
  undefined8 local_70;
  ImVec4 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar17 = GImGui;
  tab_bar->WantLayout = false;
  iVar21 = (tab_bar->Tabs).Size;
  if (iVar21 < 1) {
    iVar22 = 0;
  }
  else {
    lVar32 = 0;
    uVar29 = 0;
    uVar31 = 0;
    do {
      pIVar24 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar24->LastFrameVisible + lVar32) < tab_bar->PrevFrameVisible) {
        if (*(ImGuiID *)((long)&pIVar24->ID + lVar32) == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        iVar21 = (int)uVar31;
        if (uVar29 != uVar31) {
          if ((long)(tab_bar->Tabs).Size <= (long)uVar29) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          }
          puVar28 = (undefined8 *)((long)&((tab_bar->Tabs).Data)->ID + lVar32);
          if ((tab_bar->Tabs).Size <= iVar21) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          }
          pIVar24 = (tab_bar->Tabs).Data;
          uVar2 = *puVar28;
          uVar7 = puVar28[1];
          uVar8 = puVar28[2];
          uVar9 = puVar28[3];
          pIVar23 = pIVar24 + iVar21;
          pIVar23->NameOffset = (int)uVar8;
          pIVar23->Offset = (float)(int)((ulong)uVar8 >> 0x20);
          *(undefined8 *)(&pIVar23->NameOffset + 2) = uVar9;
          pIVar24 = pIVar24 + iVar21;
          pIVar24->ID = (int)uVar2;
          pIVar24->Flags = (int)((ulong)uVar2 >> 0x20);
          pIVar24->LastFrameVisible = (int)uVar7;
          pIVar24->LastFrameSelected = (int)((ulong)uVar7 >> 0x20);
        }
        uVar31 = (ulong)(iVar21 + 1);
      }
      iVar22 = (int)uVar31;
      uVar29 = uVar29 + 1;
      iVar21 = (tab_bar->Tabs).Size;
      lVar32 = lVar32 + 0x20;
    } while ((long)uVar29 < (long)iVar21);
  }
  if (iVar21 != iVar22) {
    iVar21 = (tab_bar->Tabs).Capacity;
    if (iVar21 < iVar22) {
      if (iVar21 == 0) {
        iVar27 = 8;
      }
      else {
        iVar27 = iVar21 / 2 + iVar21;
      }
      if (iVar27 <= iVar22) {
        iVar27 = iVar22;
      }
      if (iVar21 < iVar27) {
        pIVar23 = (ImGuiTabItem *)MemAlloc((long)iVar27 << 5);
        pIVar24 = (tab_bar->Tabs).Data;
        if (pIVar24 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar23,pIVar24,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar23;
        (tab_bar->Tabs).Capacity = iVar27;
      }
    }
    (tab_bar->Tabs).Size = iVar22;
  }
  local_d4 = tab_bar->NextSelectedTabId;
  if (local_d4 == 0) {
    local_d4 = 0;
  }
  else {
    tab_bar->SelectedTabId = local_d4;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar24 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar24 != (ImGuiTabItem *)0x0) {
      iVar21 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar24);
      uVar26 = tab_bar->ReorderRequestDir + iVar21;
      if ((-1 < (int)uVar26) && ((int)uVar26 < (tab_bar->Tabs).Size)) {
        pIVar4 = (tab_bar->Tabs).Data;
        local_68.x = (float)pIVar24->ID;
        local_68.y = (float)pIVar24->Flags;
        local_68.z = (float)pIVar24->LastFrameVisible;
        local_68.w = (float)pIVar24->LastFrameSelected;
        local_58._0_4_ = pIVar24->NameOffset;
        local_58._4_4_ = pIVar24->Offset;
        uStack_50._0_4_ = pIVar24->Width;
        uStack_50._4_4_ = pIVar24->ContentWidth;
        pIVar23 = pIVar4 + uVar26;
        IVar14 = pIVar23->ID;
        IVar15 = pIVar23->Flags;
        iVar21 = pIVar23->LastFrameVisible;
        iVar22 = pIVar23->LastFrameSelected;
        pIVar23 = pIVar4 + uVar26;
        fVar37 = pIVar23->Offset;
        uVar2 = *(undefined8 *)(&pIVar23->NameOffset + 2);
        pIVar24->NameOffset = pIVar23->NameOffset;
        pIVar24->Offset = fVar37;
        *(undefined8 *)&pIVar24->Width = uVar2;
        pIVar24->ID = IVar14;
        pIVar24->Flags = IVar15;
        pIVar24->LastFrameVisible = iVar21;
        pIVar24->LastFrameSelected = iVar22;
        pIVar24 = pIVar4 + uVar26;
        pIVar24->ID = (ImGuiID)local_68.x;
        pIVar24->Flags = (ImGuiTabItemFlags)local_68.y;
        pIVar24->LastFrameVisible = (int)local_68.z;
        pIVar24->LastFrameSelected = (int)local_68.w;
        pIVar24 = pIVar4 + uVar26;
        pIVar24->NameOffset = (undefined4)local_58;
        pIVar24->Offset = (float)local_58._4_4_;
        *(undefined8 *)(&pIVar24->NameOffset + 2) = uStack_50;
        if (pIVar4[uVar26].ID == tab_bar->SelectedTabId) {
          local_d4 = pIVar4[uVar26].ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar16 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar5 = GImGui->CurrentWindow;
    fVar37 = (GImGui->Style).FramePadding.y;
    fVar36 = GImGui->FontSize;
    IVar35 = (pIVar5->DC).CursorPos;
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar37;
    (pIVar5->DC).CursorPos.y = fVar40;
    (tab_bar->BarRect).Min.x = fVar36 + fVar37 + (tab_bar->BarRect).Min.x;
    local_68.x = (pIVar16->Style).Colors[0].x;
    local_68.y = (pIVar16->Style).Colors[0].y;
    uVar10 = (pIVar16->Style).Colors[0].z;
    uVar11 = (pIVar16->Style).Colors[0].w;
    local_68.w = (float)uVar11 * 0.5;
    local_68.z = (float)uVar10;
    pIVar24 = (ImGuiTabItem *)0x0;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar18 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar18) {
      if ((tab_bar->Tabs).Size < 1) {
        pIVar24 = (ImGuiTabItem *)0x0;
      }
      else {
        lVar32 = 0;
        lVar30 = 0;
        pIVar24 = (ImGuiTabItem *)0x0;
        do {
          pIVar4 = (tab_bar->Tabs).Data;
          pIVar23 = (ImGuiTabItem *)((long)&pIVar4->ID + lVar32);
          pcVar25 = ImGuiTabBar::GetTabName(tab_bar,pIVar23);
          local_88.x = 0.0;
          local_88.y = 0.0;
          bVar18 = Selectable(pcVar25,tab_bar->SelectedTabId ==
                                      *(ImGuiID *)((long)&pIVar4->ID + lVar32),0,(ImVec2 *)&local_88
                             );
          if (bVar18) {
            pIVar24 = pIVar23;
          }
          lVar30 = lVar30 + 1;
          lVar32 = lVar32 + 0x20;
        } while (lVar30 < (tab_bar->Tabs).Size);
      }
      EndPopup();
    }
    (pIVar5->DC).CursorPos = IVar35;
    if (pIVar24 != (ImGuiTabItem *)0x0) {
      local_d4 = pIVar24->ID;
      tab_bar->SelectedTabId = local_d4;
    }
  }
  iVar21 = (tab_bar->Tabs).Size;
  iVar22 = (pIVar17->ShrinkWidthBuffer).Capacity;
  if (iVar22 < iVar21) {
    if (iVar22 == 0) {
      iVar27 = 8;
    }
    else {
      iVar27 = iVar22 / 2 + iVar22;
    }
    if (iVar27 <= iVar21) {
      iVar27 = iVar21;
    }
    if (iVar22 < iVar27) {
      __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar27 << 3);
      __src = (pIVar17->ShrinkWidthBuffer).Data;
      if (__src != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(__dest,__src,(long)(pIVar17->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar17->ShrinkWidthBuffer).Data);
      }
      (pIVar17->ShrinkWidthBuffer).Data = __dest;
      (pIVar17->ShrinkWidthBuffer).Capacity = iVar27;
    }
  }
  (pIVar17->ShrinkWidthBuffer).Size = iVar21;
  if ((tab_bar->Tabs).Size < 1) {
    bVar18 = true;
    local_d0 = (ImGuiTabItem *)0x0;
    fVar37 = 0.0;
  }
  else {
    fVar37 = 0.0;
    bVar18 = false;
    lVar32 = 0;
    lVar30 = 0;
    local_d0 = (ImGuiTabItem *)0x0;
    do {
      pIVar24 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar24->LastFrameVisible + lVar32) < tab_bar->PrevFrameVisible) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1a7d,"TabBarLayout","ImGui ASSERT FAILED: %s",
                    "tab->LastFrameVisible >= tab_bar->PrevFrameVisible");
      }
      pIVar23 = (ImGuiTabItem *)((long)&pIVar24->ID + lVar32);
      if ((local_d0 == (ImGuiTabItem *)0x0) ||
         (local_d0->LastFrameSelected < *(int *)((long)&pIVar24->LastFrameSelected + lVar32))) {
        local_d0 = pIVar23;
      }
      if (*(ImGuiID *)((long)&pIVar24->ID + lVar32) == tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      pcVar25 = ImGuiTabBar::GetTabName(tab_bar,pIVar23);
      IVar35 = TabItemCalcSize(pcVar25,(*(uint *)((long)&pIVar24->Flags + lVar32) >> 0x14 & 1) == 0)
      ;
      *(float *)((long)&pIVar24->ContentWidth + lVar32) = IVar35.x;
      if (lVar30 == 0) {
        fVar36 = 0.0;
      }
      else {
        fVar36 = (pIVar17->Style).ItemInnerSpacing.x;
      }
      if ((pIVar17->ShrinkWidthBuffer).Size <= lVar30) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (pIVar17->ShrinkWidthBuffer).Data[lVar30].Index = (int)lVar30;
      fVar40 = *(float *)((long)&pIVar24->ContentWidth + lVar32);
      if ((pIVar17->ShrinkWidthBuffer).Size <= lVar30) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      fVar37 = fVar37 + IVar35.x + fVar36;
      (pIVar17->ShrinkWidthBuffer).Data[lVar30].Width = fVar40;
      lVar30 = lVar30 + 1;
      lVar32 = lVar32 + 0x20;
    } while (lVar30 < (tab_bar->Tabs).Size);
    bVar18 = !bVar18;
  }
  fVar36 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar36 = (float)(-(uint)(0.0 <= fVar36) & (uint)fVar36);
  fVar37 = (float)(-(uint)(fVar36 < fVar37) & (uint)(fVar37 - fVar36));
  if ((fVar37 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (0 < (tab_bar->Tabs).Size) {
      fVar37 = GImGui->FontSize * 20.0;
      lVar30 = 0x1c;
      lVar32 = 0;
      do {
        pIVar24 = (tab_bar->Tabs).Data;
        fVar36 = *(float *)((long)&pIVar24->ID + lVar30);
        if (fVar37 <= fVar36) {
          fVar36 = fVar37;
        }
        *(float *)((long)pIVar24 + lVar30 + -4) = fVar36;
        if (fVar36 <= 0.0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x1aa4,"TabBarLayout","ImGui ASSERT FAILED: %s","tab->Width > 0.0f");
        }
        lVar32 = lVar32 + 1;
        lVar30 = lVar30 + 0x20;
      } while (lVar32 < (tab_bar->Tabs).Size);
    }
  }
  else {
    ShrinkWidths((pIVar17->ShrinkWidthBuffer).Data,(pIVar17->ShrinkWidthBuffer).Size,fVar37);
    if (0 < (tab_bar->Tabs).Size) {
      lVar32 = 0;
      do {
        if ((pIVar17->ShrinkWidthBuffer).Size <= lVar32) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        fVar37 = (pIVar17->ShrinkWidthBuffer).Data[lVar32].Width;
        if ((pIVar17->ShrinkWidthBuffer).Size <= lVar32) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        iVar21 = (pIVar17->ShrinkWidthBuffer).Data[lVar32].Index;
        if ((tab_bar->Tabs).Size <= iVar21) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        (tab_bar->Tabs).Data[iVar21].Width = (float)(int)fVar37;
        lVar32 = lVar32 + 1;
      } while (lVar32 < (tab_bar->Tabs).Size);
    }
  }
  tab_bar->OffsetNextTab = 0.0;
  iVar21 = (tab_bar->Tabs).Size;
  if ((long)iVar21 < 1) {
    fVar37 = 0.0;
    fVar36 = 0.0;
  }
  else {
    pIVar24 = (tab_bar->Tabs).Data;
    fVar40 = (pIVar17->Style).ItemInnerSpacing.x;
    fVar37 = 0.0;
    fVar36 = 0.0;
    lVar32 = 0;
    do {
      *(float *)((long)&pIVar24->Offset + lVar32) = fVar37;
      if ((local_d4 == 0) &&
         (local_d4 = *(ImGuiID *)((long)&pIVar24->ID + lVar32),
         pIVar17->NavJustMovedToId != local_d4)) {
        local_d4 = 0;
      }
      uVar2 = *(undefined8 *)((long)&pIVar24->Width + lVar32);
      fVar37 = fVar37 + (float)uVar2 + fVar40;
      fVar36 = fVar36 + (float)((ulong)uVar2 >> 0x20) + fVar40;
      lVar32 = lVar32 + 0x20;
    } while ((long)iVar21 << 5 != lVar32);
  }
  fVar40 = (pIVar17->Style).ItemInnerSpacing.x;
  fVar37 = fVar37 - fVar40;
  fVar36 = fVar36 - fVar40;
  fVar37 = (float)(-(uint)(0.0 <= fVar37) & (uint)fVar37);
  tab_bar->OffsetMax = fVar37;
  pIVar16 = GImGui;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar36) & (uint)fVar36);
  if (((1 < iVar21) &&
      (fVar36 = (tab_bar->BarRect).Min.x, (tab_bar->BarRect).Max.x - fVar36 < fVar37)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar5 = GImGui->CurrentWindow;
    fVar41 = GImGui->FontSize + -2.0;
    fVar37 = (GImGui->Style).FramePadding.y;
    fVar33 = fVar41 + fVar41;
    fVar40 = (tab_bar->BarRect).Max.x;
    fVar34 = (pIVar5->DC).CursorPos.x;
    bVar6 = false;
    if (((fVar36 <= fVar34) &&
        (fVar36 = (pIVar5->DC).CursorPos.y, (tab_bar->BarRect).Min.y <= fVar36)) &&
       (fVar34 + fVar33 <= fVar40)) {
      bVar6 = fVar36 <= (tab_bar->BarRect).Max.y;
    }
    local_48 = ZEXT416((uint)fVar41);
    size.y = fVar37 + fVar37 + GImGui->FontSize;
    size.x = fVar41;
    IVar35 = (pIVar5->DC).CursorPos;
    if (!bVar6) {
      local_68.y = (tab_bar->BarRect).Max.y + 0.0;
      local_68.x = (GImGui->Style).ItemInnerSpacing.x + fVar40;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_68,true);
    }
    local_68.x = (pIVar16->Style).Colors[0].x;
    local_68.y = (pIVar16->Style).Colors[0].y;
    uVar12 = (pIVar16->Style).Colors[0].z;
    uVar13 = (pIVar16->Style).Colors[0].w;
    local_68.w = (float)uVar13 * 0.5;
    local_68.z = (float)uVar12;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_70._0_4_ = (pIVar16->IO).KeyRepeatDelay;
    local_70._4_4_ = (pIVar16->IO).KeyRepeatRate;
    (pIVar16->IO).KeyRepeatDelay = 0.25;
    (pIVar16->IO).KeyRepeatRate = 0.2;
    fVar37 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar33;
    (pIVar5->DC).CursorPos.y = fVar37;
    bVar19 = ArrowButtonEx("##<",0,size,3);
    fVar37 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (float)local_48._0_4_ + ((tab_bar->BarRect).Max.x - fVar33);
    (pIVar5->DC).CursorPos.y = fVar37;
    bVar20 = ArrowButtonEx("##>",1,size,3);
    iVar21 = -(uint)bVar19;
    if (bVar20) {
      iVar21 = 1;
    }
    PopStyleColor(2);
    (pIVar16->IO).KeyRepeatDelay = (float)(undefined4)local_70;
    (pIVar16->IO).KeyRepeatRate = (float)local_70._4_4_;
    if (!bVar6) {
      PopClipRect();
    }
    if ((iVar21 == 0) ||
       (pIVar24 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), pIVar24 == (ImGuiTabItem *)0x0)
       ) {
      pIVar24 = (ImGuiTabItem *)0x0;
    }
    else {
      iVar22 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar24);
      iVar21 = iVar21 + iVar22;
      if ((iVar21 < 0) || ((tab_bar->Tabs).Size <= iVar21)) {
        iVar21 = iVar22;
      }
      if ((tab_bar->Tabs).Size <= iVar21) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar24 = (tab_bar->Tabs).Data + iVar21;
    }
    (pIVar5->DC).CursorPos = IVar35;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar33 + 1.0);
    if (pIVar24 != (ImGuiTabItem *)0x0) {
      local_d4 = pIVar24->ID;
      tab_bar->SelectedTabId = local_d4;
    }
  }
  if (bVar18) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (local_d0 != (ImGuiTabItem *)0x0)) {
    local_d4 = local_d0->ID;
    tab_bar->SelectedTabId = local_d4;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_d4 != 0) &&
     (pIVar24 = TabBarFindTabByID(tab_bar,local_d4), pIVar24 != (ImGuiTabItem *)0x0)) {
    fVar37 = GImGui->FontSize;
    iVar21 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar24);
    fVar36 = fVar37;
    if (iVar21 < 1) {
      fVar36 = -0.0;
    }
    fVar36 = pIVar24->Offset - fVar36;
    if ((tab_bar->Tabs).Size <= iVar21 + 1) {
      fVar37 = 1.0;
    }
    fVar37 = pIVar24->Offset + pIVar24->Width + fVar37;
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    if ((fVar36 < tab_bar->ScrollingTarget) ||
       (fVar40 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x, fVar40 <= fVar37 - fVar36)) {
      fVar34 = tab_bar->ScrollingAnim - fVar37;
    }
    else {
      if (fVar37 - fVar40 <= tab_bar->ScrollingTarget) goto LAB_001eb709;
      fVar34 = (fVar36 - fVar40) - tab_bar->ScrollingAnim;
      fVar36 = fVar37 - fVar40;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar34) & (uint)fVar34);
    tab_bar->ScrollingTarget = fVar36;
  }
LAB_001eb709:
  fVar37 = tab_bar->OffsetMax - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  uVar1 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar38._4_4_ = uVar3;
  auVar38._0_4_ = uVar1;
  auVar38._8_8_ = 0;
  auVar39._4_4_ = fVar37;
  auVar39._0_4_ = fVar37;
  auVar39._8_4_ = fVar37;
  auVar39._12_4_ = fVar37;
  auVar39 = minps(auVar38,auVar39);
  fVar37 = (float)(-(uint)(0.0 <= auVar39._0_4_) & (uint)auVar39._0_4_);
  fVar36 = (float)(-(uint)(0.0 <= auVar39._4_4_) & (uint)auVar39._4_4_);
  tab_bar->ScrollingAnim = fVar37;
  tab_bar->ScrollingTarget = fVar36;
  if ((fVar37 != fVar36) || (NAN(fVar37) || NAN(fVar36))) {
    fVar40 = pIVar17->FontSize;
    fVar34 = fVar40 * 70.0;
    uVar26 = -(uint)(fVar34 <= tab_bar->ScrollingSpeed);
    fVar33 = ABS(fVar36 - fVar37) / 0.3;
    fVar34 = (float)(~uVar26 & (uint)fVar34 | (uint)tab_bar->ScrollingSpeed & uVar26);
    uVar26 = -(uint)(fVar33 <= fVar34);
    fVar33 = (float)(~uVar26 & (uint)fVar33 | uVar26 & (uint)fVar34);
    tab_bar->ScrollingSpeed = fVar33;
    fVar34 = fVar36;
    if ((pIVar17->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar40 * 10.0)) {
      fVar33 = fVar33 * (pIVar17->IO).DeltaTime;
      if (fVar36 <= fVar37) {
        fVar34 = fVar37;
        if (fVar36 < fVar37) {
          fVar37 = fVar37 - fVar33;
          uVar26 = -(uint)(fVar36 <= fVar37);
          fVar34 = (float)((uint)fVar37 & uVar26 | ~uVar26 & (uint)fVar36);
        }
      }
      else {
        fVar34 = fVar37 + fVar33;
        if (fVar36 <= fVar34) {
          fVar34 = fVar36;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar34;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar21 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar21 < 0) {
      uVar26 = iVar21 / 2 + iVar21;
      size_00 = 0;
      if (0 < (int)uVar26) {
        size_00 = (size_t)uVar26;
      }
      __dest_00 = (char *)MemAlloc(size_00);
      pcVar25 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar25 != (char *)0x0) {
        memcpy(__dest_00,pcVar25,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = (int)size_00;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}